

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void __thiscall spirv_cross::SPIREntryPoint::~SPIREntryPoint(SPIREntryPoint *this)

{
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->flags).higher._M_h);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::~SmallVector
            (&this->interface_variables);
  ::std::__cxx11::string::~string((string *)&this->orig_name);
  ::std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

SPIREntryPoint(FunctionID self_, spv::ExecutionModel execution_model, const std::string &entry_name)
	    : self(self_)
	    , name(entry_name)
	    , orig_name(entry_name)
	    , model(execution_model)
	{
	}